

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O2

uint __thiscall VolumeFile::getNodeByPath(VolumeFile *this,string *filePath,NodeKey *nodeKey)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  size_type sVar4;
  size_type sVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  pointer pbVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  EntryBTree entryBtree;
  NodeBTree nodeBtree;
  StringKey nameKey;
  StringBTree extBtree;
  StringBTree nameBtree;
  is_any_ofF<char> local_68;
  string normalizedFilePath;
  
  if (this->m_entryTreeCount == 0) {
    uVar8 = 0xffffffff;
  }
  else {
    (*this->_vptr_VolumeFile[5])(&normalizedFilePath,this,filePath);
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    boost::algorithm::is_any_of<char[2]>(&local_68,(char (*) [2])"/");
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
              (&parts,&normalizedFilePath,&local_68,token_compress_on);
    boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_68);
    if (parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        parts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0011bdb5:
      uVar8 = 0xffffffff;
    }
    else {
      puVar1 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar7 = 0;
      uVar8 = 0;
      nameBtree.super_BTree<StringBTree,_StringKey>.m_data =
           (BTree<StringBTree,_StringKey>)(puVar1 + this->m_nameTreeOffset);
      extBtree.super_BTree<StringBTree,_StringKey>.m_data =
           (BTree<StringBTree,_StringKey>)(puVar1 + this->m_extTreeOffset);
      do {
        if ((ulong)((long)parts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)parts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)uVar8)
        goto LAB_0011bdb5;
        pbVar9 = parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8;
        sVar4 = std::__cxx11::string::rfind((char)pbVar9,0x2e);
        sVar5 = sVar4;
        if (sVar4 == 0xffffffffffffffff) {
          sVar5 = pbVar9->_M_string_length;
        }
        nameKey.m_value = (pbVar9->_M_dataplus)._M_p;
        nameKey.m_length = 0;
        uVar2 = (uint)sVar5;
        if (uVar2 == 0xffffffff) {
          sVar6 = strlen(nameKey.m_value);
          uVar2 = (uint)sVar6;
        }
        nameKey.m_length = uVar2;
        uVar2 = BTree<StringBTree,_StringKey>::searchByKey
                          (&nameBtree.super_BTree<StringBTree,_StringKey>,&nameKey);
        if (uVar2 == 0xffffffff) goto LAB_0011bdb5;
        if (sVar4 == 0xffffffffffffffff) {
          uVar3 = 0;
        }
        else {
          std::__cxx11::string::substr((ulong)&nodeBtree,(ulong)pbVar9);
          entryBtree.super_BTree<EntryBTree,_EntryKey>.m_data =
               (BTree<EntryBTree,_EntryKey>)
               (BTree<EntryBTree,_EntryKey>)nodeBtree.super_BTree<NodeBTree,_NodeKey>.m_data;
          if (nodeBtree._8_4_ == -1) {
            strlen((char *)nodeBtree.super_BTree<NodeBTree,_NodeKey>.m_data);
          }
          uVar3 = BTree<StringBTree,_StringKey>::searchByKey
                            (&extBtree.super_BTree<StringBTree,_StringKey>,(StringKey *)&entryBtree)
          ;
          std::__cxx11::string::~string((string *)&nodeBtree);
          if (uVar3 == 0xffffffff) goto LAB_0011bdb5;
        }
        entryBtree.super_BTree<EntryBTree,_EntryKey>.m_data =
             (BTree<EntryBTree,_EntryKey>)
             ((this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start +
             (this->m_entryTreeOffsets).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7]);
        nodeBtree._12_4_ = 0xffffffff;
        nodeBtree.super_BTree<NodeBTree,_NodeKey>.m_data = (uint8_t *)((ulong)uVar2 << 0x20);
        nodeBtree._8_4_ = uVar3;
        uVar2 = BTree<EntryBTree,_EntryKey>::searchByKey
                          (&entryBtree.super_BTree<EntryBTree,_EntryKey>,(EntryKey *)&nodeBtree);
        if (uVar2 == 0xffffffff) goto LAB_0011bdb5;
        uVar8 = uVar8 + 1;
        uVar7 = (ulong)(uint)nodeBtree._12_4_;
      } while (((ulong)nodeBtree.super_BTree<NodeBTree,_NodeKey>.m_data & 1) != 0);
      uVar8 = 0xffffffff;
      if (nodeBtree._12_4_ != -1) {
        nodeBtree.super_BTree<NodeBTree,_NodeKey>.m_data =
             (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start + this->m_nodeTreeOffset;
        nodeBtree.m_hasMultipleVolumes =
             1 < (ulong)(((long)(this->m_dataStreams).
                                super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_dataStreams).
                               super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x250);
        nodeKey->m_flags = 0;
        nodeKey->m_nodeIndex = nodeBtree._12_4_;
        nodeKey->m_size1 = 0;
        nodeKey->m_size2 = 0;
        nodeKey->m_volumeIndex = 0xffffffff;
        nodeKey->m_sectorIndex = 0;
        uVar8 = BTree<NodeBTree,_NodeKey>::searchByKey
                          (&nodeBtree.super_BTree<NodeBTree,_NodeKey>,nodeKey);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&parts);
    std::__cxx11::string::~string((string *)&normalizedFilePath);
  }
  return uVar8;
}

Assistant:

unsigned int VolumeFile::getNodeByPath(const std::string& filePath, NodeKey& nodeKey) const
{
	if (m_entryTreeCount == 0) {
		return NodeBTree::INVALID_INDEX;
	}
	
	const auto normalizedFilePath = normalizeFilePath(filePath);
	std::vector<std::string> parts;
	boost::algorithm::split(
		parts,
		normalizedFilePath,
		boost::algorithm::is_any_of("/"),
		boost::algorithm::token_compress_on
	);

	if (parts.empty()) {
		return NodeBTree::INVALID_INDEX;
	}
	
	const StringBTree nameBtree(
		advancePointer(m_data.data(), nameTreeOffset())
	);
	const StringBTree extBtree(
		advancePointer(m_data.data(), extTreeOffset())
	);

	auto nodeIndex = NodeBTree::INVALID_INDEX;
	for (auto i = 0u, entryTreeIndex = 0u; i < parts.size(); ++i) {
		const auto& part = parts[i];
		const auto dotPos = part.find_last_of('.');
		
		const auto nameLength = (dotPos != std::string::npos) ? dotPos : part.size();
		StringKey nameKey(part.c_str(), static_cast<uint32_t>(nameLength));
		const auto nameIndex = nameBtree.searchByKey(nameKey);
		if (nameIndex == StringBTree::INVALID_INDEX) {
			break;
		}
		
		auto extIndex = 0u;
		if (dotPos != std::string::npos) {
			const auto extPart = part.substr(dotPos);
			const auto extLength = extPart.size();
			StringKey extKey(extPart.c_str(), static_cast<uint32_t>(extLength));
			extIndex = extBtree.searchByKey(extKey);
			if (extIndex == StringBTree::INVALID_INDEX) {
				break;
			}
		}
		
		const EntryBTree entryBtree(
			advancePointer(m_data.data(), entryTreeOffset(entryTreeIndex))
		);
		EntryKey entryKey(nameIndex, extIndex);
		const auto entryIndex = entryBtree.searchByKey(entryKey);
		if (entryIndex == EntryBTree::INVALID_INDEX) {
			break;
		}
		
		if (entryKey.isDirectory()) {
			entryTreeIndex = entryKey.linkIndex();
		} else {
			nodeIndex = entryKey.linkIndex();
			break;
		}
	}
	if (nodeIndex == NodeBTree::INVALID_INDEX) {
		return NodeBTree::INVALID_INDEX;
	}
	
	const NodeBTree nodeBtree(
		advancePointer(m_data.data(), nodeTreeOffset()),
		hasMultipleVolumes()
	);
	nodeKey = NodeKey(nodeIndex);
	nodeIndex = nodeBtree.searchByKey(nodeKey);
	if (nodeIndex == NodeBTree::INVALID_INDEX) {
		return NodeBTree::INVALID_INDEX;
	}
	
	return nodeIndex;
}